

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateConcatLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *this_00;
  int iVar2;
  pointer pcVar3;
  key_type *__k;
  bool bVar4;
  undefined1 *puVar5;
  LogMessage *other;
  iterator iVar6;
  Type *__k_00;
  mapped_type *pmVar7;
  long *plVar8;
  long lVar9;
  long *plVar10;
  Result *_result;
  long lVar11;
  _Rb_tree_header *p_Var12;
  string err;
  undefined1 local_110 [56];
  Rep *local_d8;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  validateInputCount(__return_storage_ptr__,layer,2,-1);
  bVar4 = Result::good(__return_storage_ptr__);
  if (bVar4) {
    pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
    paVar1 = &(__return_storage_ptr__->m_message).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
    if (bVar4) {
      validateOutputCount(__return_storage_ptr__,layer,1,1);
      bVar4 = Result::good(__return_storage_ptr__);
      if (bVar4) {
        pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar3 != paVar1) {
          operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
        }
        if (bVar4) {
          if (this->ndArrayInterpretation == true) {
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Concat","");
            this_00 = &this->blobNameToRank;
            validateInputOutputRankEquality(__return_storage_ptr__,layer,&local_70,this_00);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
            bVar4 = Result::good(__return_storage_ptr__);
            if (!bVar4) {
              return __return_storage_ptr__;
            }
            pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar3 != paVar1) {
              operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
            }
            if (!bVar4) {
              return __return_storage_ptr__;
            }
            if (layer->_oneof_case_[0] == 0x140) {
              puVar5 = *(undefined1 **)&layer->layer_;
            }
            else {
              puVar5 = Specification::_ConcatLayerParams_default_instance_;
            }
            pcVar3 = local_110 + 0x10;
            local_110._0_8_ = pcVar3;
            if (((MeanVarianceNormalizeLayerParams *)puVar5)->acrosschannels_ == true) {
              std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"Concat","");
              validateRankCount(__return_storage_ptr__,layer,(string *)local_110,5,-1,this_00);
              if ((pointer)local_110._0_8_ != pcVar3) {
                operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
              }
              bVar4 = Result::good(__return_storage_ptr__);
            }
            else {
              std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"Concat","");
              validateRankCount(__return_storage_ptr__,layer,(string *)local_110,3,-1,this_00);
              if ((pointer)local_110._0_8_ != pcVar3) {
                operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
              }
              bVar4 = Result::good(__return_storage_ptr__);
            }
            if (bVar4 == false) {
              return __return_storage_ptr__;
            }
            pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar3 != paVar1) {
              operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
            }
            if (bVar4 == false) {
              return __return_storage_ptr__;
            }
            if ((layer->input_).super_RepeatedPtrFieldBase.current_size_ < 1) {
              google::protobuf::internal::LogMessage::LogMessage
                        ((LogMessage *)local_110,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                         ,0x358);
              other = google::protobuf::internal::LogMessage::operator<<
                                ((LogMessage *)local_110,"CHECK failed: (index) < (current_size_): "
                                );
              google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_d0,other);
              google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_110);
            }
            iVar6 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ::find(&this_00->_M_t,
                           (key_type *)
                           ((layer->input_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
            p_Var12 = &(this->blobNameToRank)._M_t._M_impl.super__Rb_tree_header;
            if ((_Rb_tree_header *)iVar6._M_node != p_Var12) {
              __k_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                       Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                 (&(layer->input_).super_RepeatedPtrFieldBase,0);
              pmVar7 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       ::at(this_00,__k_00);
              local_d8 = (layer->input_).super_RepeatedPtrFieldBase.rep_;
              if (local_d8 != (Rep *)0x0) {
                local_d8 = (Rep *)local_d8->elements;
              }
              lVar9 = (long)(layer->input_).super_RepeatedPtrFieldBase.current_size_;
              if (lVar9 != 0) {
                iVar2 = *pmVar7;
                lVar11 = 0;
                do {
                  __k = *(key_type **)((long)local_d8->elements + lVar11 + -8);
                  iVar6 = std::
                          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                          ::find(&this_00->_M_t,__k);
                  if (((_Rb_tree_header *)iVar6._M_node != p_Var12) &&
                     (pmVar7 = std::
                               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                               ::at(this_00,__k), iVar2 != *pmVar7)) {
                    local_d0._M_string_length = 0;
                    local_d0.field_2._M_local_buf[0] = '\0';
                    plVar8 = (long *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
                    lVar9 = *plVar8;
                    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
                    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_b0,lVar9,plVar8[1] + lVar9);
                    std::operator+(&local_90,"Layer \'",&local_b0);
                    plVar8 = (long *)std::__cxx11::string::append((char *)&local_90);
                    plVar10 = plVar8 + 2;
                    if ((long *)*plVar8 == plVar10) {
                      local_40 = *plVar10;
                      lStack_38 = plVar8[3];
                      local_50 = &local_40;
                    }
                    else {
                      local_40 = *plVar10;
                      local_50 = (long *)*plVar8;
                    }
                    local_48 = plVar8[1];
                    *plVar8 = (long)plVar10;
                    plVar8[1] = 0;
                    *(undefined1 *)(plVar8 + 2) = 0;
                    std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_50);
                    if (local_50 != &local_40) {
                      operator_delete(local_50,local_40 + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_90._M_dataplus._M_p != &local_90.field_2) {
                      operator_delete(local_90._M_dataplus._M_p,
                                      local_90.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                      operator_delete(local_b0._M_dataplus._M_p,
                                      local_b0.field_2._M_allocated_capacity + 1);
                    }
                    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_d0);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_d0._M_dataplus._M_p == &local_d0.field_2) {
                      return __return_storage_ptr__;
                    }
                    operator_delete(local_d0._M_dataplus._M_p,
                                    CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                                             local_d0.field_2._M_local_buf[0]) + 1);
                    return __return_storage_ptr__;
                  }
                  lVar11 = lVar11 + 8;
                } while (lVar9 << 3 != lVar11);
              }
            }
          }
          Result::Result(__return_storage_ptr__);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateConcatLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 2, -1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    if (ndArrayInterpretation) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "Concat", blobNameToRank));

        if (layer.concat().sequenceconcat()) {
            HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRankCount(layer, "Concat", 5, -1, blobNameToRank));
        } else {
            HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRankCount(layer, "Concat", 3, -1, blobNameToRank));
        }

        // check that all inputs have same rank
        int rank = 0;
        if (blobNameToRank.find(layer.input(0)) != blobNameToRank.end()) {
            rank = blobNameToRank.at(layer.input(0));
        } else {
            return Result();
        }

        for (const auto& input : layer.input()) {
            if (blobNameToRank.find(input) != blobNameToRank.end()) {
                if (rank != blobNameToRank.at(input)) {
                    std::string err;
                    err = "Layer '" + std::string(layer.name()) + "' of type 'Concat' expects equal ranks for its inputs, but they are not equal.";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
            }
        }
    }

    return Result();
}